

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O2

char * absl::numbers_internal::FastIntToBuffer(uint64_t i,char *buffer)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint32_t i_00;
  char *pcVar4;
  uint32_t i_01;
  uint uVar5;
  
  if (i >> 0x20 == 0) {
    pcVar4 = FastIntToBuffer((uint32_t)i,buffer);
    return pcVar4;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = i;
  i_01 = SUB164(auVar2 / ZEXT816(1000000000),0);
  uVar5 = (uint32_t)i + i_01 * -1000000000;
  if ((uint)(i >> 0x29) < 0x1dcd65) {
    pcVar4 = FastIntToBuffer(i_01,buffer);
  }
  else {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = i;
    i_00 = SUB164(auVar3 / ZEXT816(100000000000),0);
    pcVar4 = FastIntToBuffer(i_00,buffer);
    anon_unknown_0::PutTwoDigits((ulong)(i_01 + i_00 * -100),pcVar4);
    pcVar4 = pcVar4 + 2;
  }
  uVar1 = (ulong)uVar5 / 10000000;
  uVar5 = (int)uVar1 * -10000000 + uVar5;
  anon_unknown_0::PutTwoDigits(uVar1,pcVar4);
  uVar1 = (ulong)uVar5 / 100000;
  uVar5 = (int)uVar1 * -100000 + uVar5;
  anon_unknown_0::PutTwoDigits(uVar1,pcVar4 + 2);
  uVar1 = (ulong)uVar5 / 1000;
  uVar5 = (int)uVar1 * -1000 + uVar5;
  anon_unknown_0::PutTwoDigits(uVar1,pcVar4 + 4);
  uVar1 = (ulong)uVar5 / 10;
  anon_unknown_0::PutTwoDigits(uVar1,pcVar4 + 6);
  *(undefined2 *)(pcVar4 + 8) =
       *(undefined2 *)
        ((anonymous_namespace)::one_ASCII_final_digits + (ulong)((int)uVar1 * -10 + uVar5) * 2);
  return pcVar4 + 9;
}

Assistant:

char* numbers_internal::FastIntToBuffer(uint64_t i, char* buffer) {
  uint32_t u32 = static_cast<uint32_t>(i);
  if (u32 == i) return numbers_internal::FastIntToBuffer(u32, buffer);

  // Here we know i has at least 10 decimal digits.
  uint64_t top_1to11 = i / 1000000000;
  u32 = static_cast<uint32_t>(i - top_1to11 * 1000000000);
  uint32_t top_1to11_32 = static_cast<uint32_t>(top_1to11);

  if (top_1to11_32 == top_1to11) {
    buffer = numbers_internal::FastIntToBuffer(top_1to11_32, buffer);
  } else {
    // top_1to11 has more than 32 bits too; print it in two steps.
    uint32_t top_8to9 = static_cast<uint32_t>(top_1to11 / 100);
    uint32_t mid_2 = static_cast<uint32_t>(top_1to11 - top_8to9 * 100);
    buffer = numbers_internal::FastIntToBuffer(top_8to9, buffer);
    PutTwoDigits(mid_2, buffer);
    buffer += 2;
  }

  // We have only 9 digits now, again the maximum uint32_t can handle fully.
  uint32_t digits = u32 / 10000000;  // 10,000,000
  u32 -= digits * 10000000;
  PutTwoDigits(digits, buffer);
  buffer += 2;
  digits = u32 / 100000;  // 100,000
  u32 -= digits * 100000;
  PutTwoDigits(digits, buffer);
  buffer += 2;
  digits = u32 / 1000;  // 1,000
  u32 -= digits * 1000;
  PutTwoDigits(digits, buffer);
  buffer += 2;
  digits = u32 / 10;
  u32 -= digits * 10;
  PutTwoDigits(digits, buffer);
  buffer += 2;
  memcpy(buffer, one_ASCII_final_digits[u32], 2);
  return buffer + 1;
}